

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O0

void __thiscall
burst::dynamic_tuple::dynamic_tuple<std::__cxx11::string,bool,void>
          (dynamic_tuple *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *head,bool *tail)

{
  initializer_list<int> iVar1;
  int local_44;
  iterator local_40;
  undefined8 local_38;
  bool *local_20;
  bool *tail_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *head_local;
  dynamic_tuple *this_local;
  
  this->m_capacity = 0x21;
  local_20 = tail;
  tail_local = (bool *)head;
  head_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::make_unique<signed_char[]>((size_t)&this->m_data);
  std::vector<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>::
  vector(&this->m_objects);
  this->m_volume = 0;
  push_back_no_realloc<std::__cxx11::string>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tail_local);
  push_back_no_realloc<bool>(this,local_20);
  local_44 = 0;
  local_40 = &local_44;
  local_38 = 1;
  iVar1._M_len = 1;
  iVar1._M_array = local_40;
  burst::detail::dummy(iVar1);
  return;
}

Assistant:

explicit dynamic_tuple (Head && head, Tail && ... tail):
            m_capacity(aligned_volume_v<Head, Tail...>),
            m_data(std::make_unique<std::int8_t[]>(m_capacity))
        {
            try
            {
                push_back_no_realloc(std::forward<Head>(head));
                BURST_EXPAND_VARIADIC(push_back_no_realloc(std::forward<Tail>(tail)));
            }
            catch (...)
            {
                destroy_all();
                throw;
            }
        }